

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O1

Type * __thiscall
QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
::operator()(QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
             *this)

{
  QBasicMutex QVar1;
  void **ppvVar2;
  undefined4 *puVar3;
  anon_struct_240_1_898a9ca8 *paVar4;
  long in_FS_OFFSET;
  QObject local_40 [8];
  code *local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)QtGlobalStatic::
            ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
            ::guard._q_value.super___atomic_base<signed_char>._M_i < -1) {
    paVar4 = (anon_struct_240_1_898a9ca8 *)0x0;
  }
  else {
    if (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>>
        ::instance()::holder == '\0') {
      QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>>
      ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>>
                    *)this);
    }
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::
        ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
        ::guard._q_value.super___atomic_base<signed_char>._M_i != -1) {
      if ((AtomicType)
          QtGlobalStatic::
          ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
          ::mutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
        LOCK();
        QtGlobalStatic::
        ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
        ::mutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
        UNLOCK();
      }
      else {
        QBasicMutex::lockInternal();
      }
      if ((__atomic_base<signed_char>)
          QtGlobalStatic::
          ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
          ::guard._q_value.super___atomic_base<signed_char>._M_i == '\0') {
        QHostInfoLookupManager::QHostInfoLookupManager
                  ((QHostInfoLookupManager *)
                   &QtGlobalStatic::
                    ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
                    ::storage);
        ppvVar2 = QCoreApplication::self;
        local_38 = QObject::destroyed;
        local_30 = 0;
        puVar3 = (undefined4 *)operator_new(0x18);
        *puVar3 = 1;
        *(code **)(puVar3 + 2) =
             QtPrivate::QCallableObject<void_(*)(),_QtPrivate::List<>,_void>::impl;
        *(code **)(puVar3 + 4) =
             QtGlobalStatic::
             ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
             ::reset;
        QObject::connectImpl
                  (local_40,ppvVar2,(QObject *)&local_38,ppvVar2,(QSlotObjectBase *)0x0,
                   (ConnectionType)puVar3,(int *)0x1,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_40);
        QtGlobalStatic::
        ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
        ::guard._q_value.super___atomic_base<signed_char>._M_i =
             (Type)(__atomic_base<signed_char>)0xff;
      }
      QVar1.d_ptr._q_value._M_b._M_p =
           QtGlobalStatic::
           ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
           ::mutex.d_ptr._q_value._M_b._M_p;
      LOCK();
      QtGlobalStatic::
      ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
      ::mutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
      UNLOCK();
      if ((AtomicType)QVar1.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
        QBasicMutex::unlockInternalFutex
                  (&QtGlobalStatic::
                    ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
                    ::mutex);
      }
    }
    paVar4 = &QtGlobalStatic::
              ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
              ::storage;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (Type *)paVar4;
}

Assistant:

Type *operator()()
    {
        if (isDestroyed())
            return nullptr;
        return instance();
    }